

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fra.h
# Opt level: O2

int Fra_OneHotNodesAreClause
              (Fra_Sml_t *pSeq,Aig_Obj_t *pObj1,Aig_Obj_t *pObj2,int fCompl1,int fCompl2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar5 = pSeq->nWordsTotal;
  lVar7 = (long)iVar5;
  lVar1 = (long)(pObj1->Id * iVar5) * 4;
  lVar2 = (long)(pObj2->Id * iVar5) * 4;
  if (fCompl2 == 0 || fCompl1 == 0) {
    if (fCompl1 == 0) {
      if (fCompl2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                      ,0x77,
                      "int Fra_OneHotNodesAreClause(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                     );
      }
      lVar6 = (long)pSeq->nWordsPref;
      do {
        if (lVar7 <= lVar6) {
          return 1;
        }
        lVar3 = lVar6 * 4;
        lVar4 = lVar6 * 4;
        lVar6 = lVar6 + 1;
      } while ((*(uint *)((long)&pSeq[1].pAig + lVar4 + lVar2) &
               ~*(uint *)((long)&pSeq[1].pAig + lVar3 + lVar1)) == 0);
    }
    else {
      lVar6 = (long)pSeq->nWordsPref;
      do {
        if (lVar7 <= lVar6) {
          return 1;
        }
        lVar3 = lVar6 * 4;
        lVar4 = lVar6 * 4;
        lVar6 = lVar6 + 1;
      } while ((*(uint *)((long)&pSeq[1].pAig + lVar4 + lVar1) &
               ~*(uint *)((long)&pSeq[1].pAig + lVar3 + lVar2)) == 0);
    }
  }
  else {
    lVar6 = (long)pSeq->nWordsPref;
    do {
      if (lVar7 <= lVar6) {
        return 1;
      }
      lVar3 = lVar6 * 4;
      lVar4 = lVar6 * 4;
      lVar6 = lVar6 + 1;
    } while ((*(uint *)((long)&pSeq[1].pAig + lVar4 + lVar1) &
             *(uint *)((long)&pSeq[1].pAig + lVar3 + lVar2)) == 0);
  }
  return 0;
}

Assistant:

static inline unsigned *   Fra_ObjSim( Fra_Sml_t * p, int Id )                           { return p->pData + p->nWordsTotal * Id; }